

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmTim.c
# Opt level: O1

int Sfm_TimPriorityNodes(Sfm_Tim_t *p,Vec_Int_t *vCands,int Window)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  Vec_Int_t *pVVar8;
  long lVar9;
  uint uVar10;
  
  if (100 < (uint)Window) {
    __assert_fail("Window >= 0 && Window <= 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                  ,0x177,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
  }
  Sfm_TimCriticalPath(p,Window);
  if (0 < (p->vLevels).nSize) {
    lVar7 = 0;
    do {
      pVVar8 = (p->vLevels).pArray;
      if (0 < pVVar8[lVar7].nSize) {
        lVar9 = 0;
        do {
          iVar2 = pVVar8[lVar7].pArray[lVar9];
          if (((long)iVar2 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar2))
          goto LAB_004bf587;
          pvVar5 = pVVar4->pArray[iVar2];
          if (pvVar5 != (void *)0x0) {
            if ((*(uint *)((long)pvVar5 + 0x14) & 0x40) == 0) {
              __assert_fail("pObj->fMarkC == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                            ,299,"void Sfm_TimUpdateClean(Sfm_Tim_t *)");
            }
            *(uint *)((long)pvVar5 + 0x14) = *(uint *)((long)pvVar5 + 0x14) & 0xffffffbf;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar8[lVar7].nSize);
      }
      pVVar8[lVar7].nSize = 0;
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vLevels).nSize);
  }
  if (0 < (p->vPath).nSize) {
    lVar7 = 0;
    do {
      iVar2 = (p->vPath).pArray[lVar7];
      if (((long)iVar2 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar2)) {
LAB_004bf587:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar5 = pVVar4->pArray[iVar2];
      if (pvVar5 != (void *)0x0) {
        uVar10 = *(uint *)((long)pvVar5 + 0x14);
        if ((uVar10 & 0x40) != 0) {
          __assert_fail("pObj->fMarkC == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmTim.c"
                        ,0x17e,"int Sfm_TimPriorityNodes(Sfm_Tim_t *, Vec_Int_t *, int)");
        }
        *(uint *)((long)pvVar5 + 0x14) = uVar10 | 0x40;
        uVar10 = uVar10 >> 0xc;
        iVar2 = *(int *)((long)pvVar5 + 0x10);
        iVar3 = (p->vLevels).nSize;
        if (iVar3 <= (int)uVar10) {
          uVar1 = uVar10 + 1;
          uVar6 = iVar3 * 2;
          if ((int)uVar6 <= (int)uVar1) {
            uVar6 = uVar1;
          }
          if ((p->vLevels).nCap < (int)uVar6) {
            pVVar8 = (p->vLevels).pArray;
            if (pVVar8 == (Vec_Int_t *)0x0) {
              pVVar8 = (Vec_Int_t *)malloc((ulong)uVar6 << 4);
            }
            else {
              pVVar8 = (Vec_Int_t *)realloc(pVVar8,(ulong)uVar6 << 4);
            }
            (p->vLevels).pArray = pVVar8;
            lVar9 = (long)(p->vLevels).nCap;
            memset(pVVar8 + lVar9,0,((int)uVar6 - lVar9) * 0x10);
            (p->vLevels).nCap = uVar6;
          }
          (p->vLevels).nSize = uVar1;
        }
        if ((p->vLevels).nSize <= (int)uVar10) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                        ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush((Vec_Int_t *)((long)&((p->vLevels).pArray)->nCap + (ulong)(uVar10 << 4)),iVar2);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vPath).nSize);
  }
  qsort((p->vLevels).pArray,(long)(p->vLevels).nSize,0x10,Vec_WecSortCompare1);
  vCands->nSize = 0;
  if (0 < (p->vLevels).nSize) {
    lVar7 = 0;
    do {
      pVVar8 = (p->vLevels).pArray;
      if (0 < pVVar8[lVar7].nSize) {
        lVar9 = 0;
        do {
          iVar2 = pVVar8[lVar7].pArray[lVar9];
          if (((long)iVar2 < 0) || (pVVar4 = p->pNtk->vObjs, pVVar4->nSize <= iVar2))
          goto LAB_004bf587;
          pvVar5 = pVVar4->pArray[iVar2];
          if ((pvVar5 != (void *)0x0) && ((*(byte *)((long)pvVar5 + 0x14) & 0x10) == 0)) {
            Vec_IntPush(vCands,*(int *)((long)pvVar5 + 0x10));
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < pVVar8[lVar7].nSize);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < (p->vLevels).nSize);
  }
  return (int)(0 < vCands->nSize);
}

Assistant:

int Sfm_TimPriorityNodes( Sfm_Tim_t * p, Vec_Int_t * vCands, int Window )
{
    Vec_Int_t * vLevel;
    Abc_Obj_t * pObj;
    int i, k;
    assert( Window >= 0 && Window <= 100 );
    // collect critical path
    Sfm_TimCriticalPath( p, Window );
    // add nodes to the levelized structure
    Sfm_TimUpdateClean( p );
    Abc_NtkForEachObjVec( &p->vPath, p->pNtk, pObj, i )
    {
        assert( pObj->fMarkC == 0 );
        pObj->fMarkC = 1;
        Vec_WecPush( &p->vLevels, Abc_ObjLevel(pObj), Abc_ObjId(pObj) );
    }
    // prioritize nodes by expected gain
    Vec_WecSort( &p->vLevels, 0 );
    Vec_IntClear( vCands );
    Vec_WecForEachLevel( &p->vLevels, vLevel, i )
        Abc_NtkForEachObjVec( vLevel, p->pNtk, pObj, k )
            if ( !pObj->fMarkA )
                Vec_IntPush( vCands, Abc_ObjId(pObj) );
//    printf( "Path = %5d   Cand = %5d\n", Vec_IntSize(&p->vPath) );
    return Vec_IntSize(vCands) > 0;
}